

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplace_back<slang::ast::Scope_const&,slang::syntax::ParameterDeclarationSyntax_const&,slang::syntax::DeclaratorSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,Scope *args,
          ParameterDeclarationSyntax *args_1,DeclaratorSyntax *args_2,bool *args_3,bool *args_4,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *args_5)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *in_RDI;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  DeclaratorSyntax *in_stack_00000008;
  DeclaratorSyntax *in_stack_00000010;
  ParameterDeclarationSyntax *in_stack_00000018;
  ParameterDecl *in_stack_00000020;
  pointer in_stack_00000028;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::Scope_const&,slang::syntax::ParameterDeclarationSyntax_const&,slang::syntax::DeclaratorSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                        ((SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)args_4,
                         in_stack_00000028,(Scope *)in_stack_00000020,in_stack_00000018,
                         in_stack_00000010,(bool *)in_stack_00000008,(bool *)args_2,
                         (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                          *)args_1);
  }
  else {
    end(in_RDI);
    attributes._M_extent._M_extent_value = (size_t)args_3;
    attributes._M_ptr = (pointer)args_4;
    ast::DefinitionSymbol::ParameterDecl::ParameterDecl
              (in_stack_00000020,(Scope *)in_stack_00000018,
               (ParameterDeclarationSyntax *)in_stack_00000010,in_stack_00000008,
               (bool)unaff_retaddr_00,(bool)unaff_retaddr,attributes);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }